

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool __thiscall ON_Brep::RemoveSlits(ON_Brep *this,ON_BrepFace *F)

{
  int iVar1;
  ON_BrepLoop *pOVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  ON_SimpleArray<int> li;
  ON_SimpleArray<int> local_30;
  
  ON_SimpleArray<int>::ON_SimpleArray(&local_30,&F->m_li);
  bVar4 = false;
  for (lVar5 = 0; lVar5 < local_30.m_count; lVar5 = lVar5 + 1) {
    iVar1 = local_30.m_a[lVar5];
    pOVar2 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a;
    if (pOVar2[iVar1].m_loop_index == iVar1) {
      bVar3 = RemoveSlits(this,pOVar2 + iVar1);
      bVar4 = (bool)(bVar4 | bVar3);
    }
  }
  ON_SimpleArray<int>::~ON_SimpleArray(&local_30);
  return bVar4;
}

Assistant:

bool ON_Brep::RemoveSlits(ON_BrepFace& F)

{
  int i;
  bool rc = false;
  ON_SimpleArray<int> li = F.m_li;
  for (i=0; i<li.Count(); i++){
    ON_BrepLoop& L = m_L[li[i]];
    if (L.m_loop_index != li[i]) 
      continue;
    if (RemoveSlits(L))
      rc = true;
  }
  return rc;
}